

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall
QtMWidgets::TableViewSection::setHighlightCellOnClick(TableViewSection *this,bool on)

{
  undefined1 uVar1;
  bool bVar2;
  TableViewSectionPrivate *pTVar3;
  TableViewCell **ppTVar4;
  QList<QtMWidgets::TableViewCell_*> *t;
  TableViewCell *cell;
  undefined1 local_48 [8];
  QForeachContainer<QList<QtMWidgets::TableViewCell_*>_> _container_750;
  bool on_local;
  TableViewSection *this_local;
  
  _container_750._47_1_ = on;
  pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
           ::operator->(&this->d);
  uVar1 = _container_750._47_1_;
  if ((pTVar3->highlightCellOnClick & 1U) != (_container_750._47_1_ & 1)) {
    pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
             ::operator->(&this->d);
    pTVar3->highlightCellOnClick = (bool)(uVar1 & 1);
    pTVar3 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
             ::operator->(&this->d);
    QtPrivate::qMakeForeachContainer<QList<QtMWidgets::TableViewCell*>&>
              ((QForeachContainer<QList<QtMWidgets::TableViewCell_*>_> *)local_48,
               (QtPrivate *)&pTVar3->cells,t);
    while( true ) {
      bVar2 = QList<QtMWidgets::TableViewCell_*>::const_iterator::operator!=
                        ((const_iterator *)&_container_750.c.d.size,_container_750.i);
      if (!bVar2) break;
      ppTVar4 = QList<QtMWidgets::TableViewCell_*>::const_iterator::operator*
                          ((const_iterator *)&_container_750.c.d.size);
      TableViewCell::setHighlightOnClick(*ppTVar4,(bool)(_container_750._47_1_ & 1));
      QList<QtMWidgets::TableViewCell_*>::const_iterator::operator++
                ((const_iterator *)&_container_750.c.d.size);
    }
    QtPrivate::QForeachContainer<QList<QtMWidgets::TableViewCell_*>_>::~QForeachContainer
              ((QForeachContainer<QList<QtMWidgets::TableViewCell_*>_> *)local_48);
  }
  return;
}

Assistant:

void
TableViewSection::setHighlightCellOnClick( bool on )
{
	if( d->highlightCellOnClick != on )
	{
		d->highlightCellOnClick = on;

		foreach( TableViewCell * cell, d->cells )
			cell->setHighlightOnClick( on );
	}
}